

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCNF.hpp
# Opt level: O2

void __thiscall
Shell::NewCNF::introduceGenClause
          (NewCNF *this,GenLit gl0,GenLit gl1,BindingList *bindings,BindingList *foolBindings)

{
  List<std::pair<Kernel::Formula_*,_bool>_> *gls;
  List<std::pair<Kernel::Formula_*,_bool>_> *pLVar1;
  
  gls = (List<std::pair<Kernel::Formula_*,_bool>_> *)
        Lib::List<std::pair<Kernel::Formula*,bool>>::operator_new(0x18);
  pLVar1 = (List<std::pair<Kernel::Formula_*,_bool>_> *)
           Lib::List<std::pair<Kernel::Formula*,bool>>::operator_new(0x18);
  (pLVar1->_head).first = gl1.first;
  (pLVar1->_head).second = gl1.second;
  pLVar1->_tail = (List<std::pair<Kernel::Formula_*,_bool>_> *)0x0;
  (gls->_head).first = gl0.first;
  (gls->_head).second = gl0.second;
  gls->_tail = pLVar1;
  introduceGenClause(this,gls,bindings,foolBindings);
  return;
}

Assistant:

void introduceGenClause(GenLit gl0, GenLit gl1, BindingList* bindings=BindingList::empty(), BindingList* foolBindings=BindingList::empty()) {
    introduceGenClause(new List<GenLit>(gl0, new List<GenLit>(gl1)), bindings, foolBindings);
  }